

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestate.c
# Opt level: O0

void transfer_state(_Bool load,char *path,em8051 *emu)

{
  uint32_t uVar1;
  uint32_t *cursor;
  uint32_t cpu [9];
  em8051 *emu_local;
  char *path_local;
  _Bool load_local;
  
  unique0x1000031d = emu;
  transfer_data(load,path,"flash.bin",flash,0x20000);
  transfer_data(load,path,"intmem.bin",stack0xffffffffffffffe0->mLowerData,0x100);
  transfer_data(load,path,"extmem.bin",stack0xffffffffffffffe0->mExtData,0x10000);
  transfer_data(load,path,"ram.bin",ram,0x80000);
  transfer_data(load,path,"sfr.bin",stack0xffffffffffffffe0->mSFR,0x80);
  cursor._0_4_ = htonl(stack0xffffffffffffffe0->mPC);
  cursor._4_4_ = htonl(stack0xffffffffffffffe0->mTickDelay);
  cpu[0] = htonl(stack0xffffffffffffffe0->mInterruptActive);
  cpu[1] = htonl(stack0xffffffffffffffe0->int_a[0]);
  cpu[2] = htonl(stack0xffffffffffffffe0->int_a[1]);
  cpu[3] = htonl(stack0xffffffffffffffe0->int_psw[0]);
  cpu[4] = htonl(stack0xffffffffffffffe0->int_psw[1]);
  cpu[5] = htonl(stack0xffffffffffffffe0->int_sp[0]);
  cpu[6] = htonl(stack0xffffffffffffffe0->int_sp[1]);
  transfer_data(load,path,"cpu.bin",(uint8_t *)&cursor,0x24);
  if (load) {
    uVar1 = ntohl((uint32_t)cursor);
    stack0xffffffffffffffe0->mPC = uVar1;
    uVar1 = ntohl(cursor._4_4_);
    stack0xffffffffffffffe0->mTickDelay = uVar1;
    uVar1 = ntohl(cpu[0]);
    stack0xffffffffffffffe0->mInterruptActive = uVar1;
    uVar1 = ntohl(cpu[1]);
    stack0xffffffffffffffe0->int_a[0] = uVar1;
    uVar1 = ntohl(cpu[2]);
    stack0xffffffffffffffe0->int_a[1] = uVar1;
    uVar1 = ntohl(cpu[3]);
    stack0xffffffffffffffe0->int_psw[0] = uVar1;
    uVar1 = ntohl(cpu[4]);
    stack0xffffffffffffffe0->int_psw[1] = uVar1;
    uVar1 = ntohl(cpu[5]);
    stack0xffffffffffffffe0->int_sp[0] = uVar1;
    uVar1 = ntohl(cpu[6]);
    stack0xffffffffffffffe0->int_sp[1] = uVar1;
    (*stack0xffffffffffffffe0->sfrwrite)(stack0xffffffffffffffe0,0x90);
  }
  return;
}

Assistant:

static void transfer_state(bool load, const char* path, struct em8051* emu) {
  transfer_data(load, path, "flash.bin", flash, sizeof(flash));
  transfer_data(load, path, "intmem.bin", emu->mLowerData, 0x100);
  transfer_data(load, path, "extmem.bin", emu->mExtData, 0x10000); // Mirror of MMIO
  transfer_data(load, path, "ram.bin", ram, sizeof(ram));
  transfer_data(load, path, "sfr.bin", emu->mSFR, 0x80);

  uint32_t cpu[] = {
    htonl(emu->mPC),
    htonl(emu->mTickDelay),
    htonl(emu->mInterruptActive),
    htonl(emu->int_a[0]), htonl(emu->int_a[1]),
    htonl(emu->int_psw[0]), htonl(emu->int_psw[1]),
    htonl(emu->int_sp[0]), htonl(emu->int_sp[1])
  };
  transfer_data(load, path, "cpu.bin", (uint8_t*)cpu, sizeof(cpu));
  if (load) {
    uint32_t* cursor = cpu;
    emu->mPC = ntohl(*cursor++);
    emu->mTickDelay = ntohl(*cursor++);
    emu->mInterruptActive = ntohl(*cursor++);
    emu->int_a[0] = ntohl(*cursor++); emu->int_a[1] = ntohl(*cursor++);
    emu->int_psw[0] = ntohl(*cursor++); emu->int_psw[1] = ntohl(*cursor++);
    emu->int_sp[0] = ntohl(*cursor++); emu->int_sp[1] = ntohl(*cursor++);
  }

  if (load) {

    // Trigger a bank switch
    emu->sfrwrite(emu, 0x80 + REG_P1);

  }
}